

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

void workspace_list_destroy(workspace_list *workspace_list)

{
  ulong local_18;
  size_t i;
  workspace_list *workspace_list_local;
  
  if (workspace_list->theme != (theme *)0x0) {
    theme_destroy(workspace_list->theme);
  }
  map_destroy(workspace_list->client_map);
  for (local_18 = 0; local_18 < workspace_list->count; local_18 = local_18 + 1) {
    if (workspace_list->workspaces[local_18] != (workspace *)0x0) {
      workspace_destroy(workspace_list->workspaces[local_18]);
    }
  }
  free(workspace_list->workspaces);
  free(workspace_list);
  return;
}

Assistant:

void workspace_list_destroy(struct workspace_list *workspace_list)
{
        if (workspace_list->theme != NULL) {
                theme_destroy(workspace_list->theme);
        }

        map_destroy(workspace_list->client_map);

        for (size_t i = 0; i < workspace_list->count; ++i) {
                if (workspace_list->workspaces[i] != NULL) {
                        workspace_destroy(workspace_list->workspaces[i]);
                }
        }

        free(workspace_list->workspaces);
        free(workspace_list);
}